

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O2

int Llb_ManTracePaths(Aig_Man_t *p,Aig_Obj_t *pPivot)

{
  int iVar1;
  Aig_Obj_t *pObj;
  int iVar2;
  int iVar3;
  
  Aig_ManIncrementTravId(p);
  Aig_ManIncrementTravId(p);
  iVar2 = 0;
  for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar3);
    iVar1 = Llb_ManTracePaths_rec(p,pObj,pPivot);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Llb_ManTracePaths( Aig_Man_t * p, Aig_Obj_t * pPivot )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManIncrementTravId( p ); // prev = visited with path to LI  (value 0)
    Aig_ManIncrementTravId( p ); // cur  = visited w/o  path to LI  (value 1)
    Saig_ManForEachLo( p, pObj, i )
        Counter += Llb_ManTracePaths_rec( p, pObj, pPivot );
    return Counter;
}